

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O3

iterator __thiscall
eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::insert
          (vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *this,iterator pos,
          value_type *val)

{
  value_type *pvVar1;
  iterator ppVar2;
  pair<eastl::pair<char,_int>_*,_bool> pVar3;
  
  ppVar2 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpBegin;
  if ((ppVar2 == pos) || (pos[-1].first < val->first)) {
    pvVar1 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd;
    if (pvVar1 == pos) {
      if ((this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpCapacity ==
          pos) goto LAB_00104c47;
      (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd = pvVar1 + 1;
      *pvVar1 = *val;
    }
    else {
      if (pos->first <= val->first) goto LAB_00104c21;
LAB_00104c47:
      vector<eastl::pair<char,_int>,_eastl::allocator>::DoInsertValue(&this->m_base,pos,val);
    }
    ppVar2 = (iterator)
             ((long)pos +
             ((long)(this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.
                    mpBegin - (long)ppVar2));
  }
  else {
LAB_00104c21:
    pVar3 = insert(this,val);
    ppVar2 = pVar3.first;
  }
  return ppVar2;
}

Assistant:

iterator insert(iterator const pos, value_type const& val) {
    return
        ((pos == begin() || m_cmp(*(pos-1), val)) &&
         (pos ==   end() || m_cmp(val, *pos)))
        ? m_base.insert(pos, val)
        : insert(val).first
        ;
  }